

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall
BER_CONTAINER::serialise(BER_CONTAINER *this,uint8_t *buf,size_t max_len,size_t known_length)

{
  size_t sVar1;
  int i;
  size_t known_length_local;
  size_t max_len_local;
  uint8_t *buf_local;
  BER_CONTAINER *this_local;
  
  this_local._4_4_ = serialise(this,buf,max_len);
  if (-1 < this_local._4_4_) {
    sVar1 = encode_ber_length_integer
                      (buf + this_local._4_4_,known_length,(int)max_len - this_local._4_4_);
    this_local._4_4_ = this_local._4_4_ + (int)sVar1;
    if (max_len < known_length + (long)this_local._4_4_) {
      this_local._4_4_ = -0x1f;
    }
  }
  return this_local._4_4_;
}

Assistant:

int BER_CONTAINER::serialise(uint8_t* buf, size_t max_len, size_t known_length){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);
    i += encode_ber_length_integer(buf+i, known_length, max_len - i);
    if(max_len < known_length + i) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    return i;
}